

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_chain.cpp
# Opt level: O0

void __thiscall Element::draw(Element *this,Context *ctx,bool highlight)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  undefined8 uVar8;
  byte in_DL;
  undefined8 *in_RSI;
  long *in_RDI;
  float fVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  float igain;
  float gain;
  float th;
  float rad;
  ALLEGRO_COLOR boxcol;
  ALLEGRO_COLOR textcol;
  float y2;
  float x2;
  undefined1 in_stack_ffffffffffffffbf;
  float in_stack_ffffffffffffffc0;
  undefined4 uVar13;
  float in_stack_ffffffffffffffc4;
  undefined4 uVar14;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar15;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar16;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar17;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar18;
  undefined8 uStack_24;
  float local_1c;
  float local_18;
  byte local_11;
  undefined8 *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  if (in_RDI[3] != 0) {
    input_point((Element *)in_RDI[3],&local_18,&local_1c);
    draw_arrow((Element *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (Context *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf);
  }
  uVar18 = (undefined4)local_10[3];
  uStack_24 = local_10[4];
  uVar14 = (undefined4)local_10[3];
  uVar15 = (undefined4)((ulong)local_10[3] >> 0x20);
  uVar16 = (undefined4)local_10[4];
  uVar17 = (undefined4)((ulong)local_10[4] >> 0x20);
  if ((local_11 & 1) != 0) {
    uVar14 = (undefined4)local_10[9];
    uVar15 = (undefined4)((ulong)local_10[9] >> 0x20);
    uVar16 = (undefined4)local_10[10];
    uVar17 = (undefined4)((ulong)local_10[10] >> 0x20);
  }
  uVar7 = (**(code **)(*in_RDI + 0x10))();
  if ((uVar7 & 1) == 0) {
    uVar18 = (undefined4)local_10[7];
    uStack_24 = local_10[8];
  }
  uVar13 = 0x40e00000;
  dVar10 = (double)*(int *)((long)in_RDI + 0xc) + 0.5;
  dVar11 = (double)((int)in_RDI[1] + (int)in_RDI[2]) - 0.5;
  dVar12 = (double)(*(int *)((long)in_RDI + 0xc) + *(int *)((long)in_RDI + 0x14)) - 0.5;
  al_draw_filled_rounded_rectangle
            ((float)(int)in_RDI[1] + 0.5,CONCAT44((int)((ulong)dVar10 >> 0x20),(float)dVar10),
             CONCAT44((int)((ulong)dVar11 >> 0x20),(float)dVar11),
             CONCAT44((int)((ulong)dVar12 >> 0x20),(float)dVar12),0x40e00000,0x40e00000,local_10[5],
             local_10[6]);
  dVar10 = (double)*(int *)((long)in_RDI + 0xc) + 0.5;
  dVar11 = (double)((int)in_RDI[1] + (int)in_RDI[2]) - 0.5;
  dVar12 = (double)(*(int *)((long)in_RDI + 0xc) + *(int *)((long)in_RDI + 0x14)) - 0.5;
  al_draw_rounded_rectangle
            ((float)(int)in_RDI[1] + 0.5,CONCAT44((int)((ulong)dVar10 >> 0x20),(float)dVar10),
             CONCAT44((int)((ulong)dVar11 >> 0x20),(float)dVar11),
             CONCAT44((int)((ulong)dVar12 >> 0x20),(float)dVar12),uVar13,uVar13,
             CONCAT44(uVar15,uVar14),CONCAT44(uVar17,uVar16));
  iVar6 = al_get_font_line_height(*local_10);
  uVar3 = *local_10;
  lVar4 = in_RDI[1];
  lVar5 = in_RDI[2];
  iVar1 = *(int *)((long)in_RDI + 0xc);
  iVar2 = *(int *)((long)in_RDI + 0x14);
  uVar8 = (**(code **)(*in_RDI + 0x30))();
  al_draw_text(uVar18,uStack_24,(float)((int)lVar4 + (int)lVar5 / 2),
               (float)(iVar1 + iVar2 / 2) + (float)iVar6 * -0.5,uVar3,1,uVar8);
  fVar9 = (float)(**(code **)(*in_RDI + 0x20))();
  if (0.0 < fVar9) {
    fVar9 = clamp(0.0,fVar9,2.0);
    dVar10 = (double)((int)in_RDI[1] + (int)in_RDI[2]);
    dVar11 = dVar10 + 3.5;
    al_draw_rectangle((float)(dVar10 + 1.5),
                      CONCAT44(0x3ff80000,
                               (float)*(int *)((long)in_RDI + 0x14) * (fVar9 * -0.5 + 1.0) +
                               (float)*(int *)((long)in_RDI + 0xc)),
                      CONCAT44((int)((ulong)dVar11 >> 0x20),(float)dVar11),
                      CONCAT44(0x400c0000,
                               (float)(*(int *)((long)in_RDI + 0xc) + *(int *)((long)in_RDI + 0x14))
                              ),(int)local_10[3],local_10[4],0x3f800000);
  }
  return;
}

Assistant:

void Element::draw(Context const& ctx, bool highlight) const
{
   if (attached_to) {
      float x2, y2;
      attached_to->input_point(x2, y2);
      draw_arrow(ctx, x2, y2, highlight);
   }

   ALLEGRO_COLOR textcol = ctx.fg;
   ALLEGRO_COLOR boxcol = ctx.fg;
   if (highlight)
      boxcol = ctx.highlight;
   if (!is_playing())
      textcol = ctx.disabled;

   float rad = 7.0;
   al_draw_filled_rounded_rectangle(x+0.5, y+0.5, x+w-0.5, y+h-0.5, rad, rad, ctx.fill);
   al_draw_rounded_rectangle(x+0.5, y+0.5, x+w-0.5, y+h-0.5, rad, rad, boxcol, 1.0);

   float th = al_get_font_line_height(ctx.font);
   al_draw_text(ctx.font, textcol, x + w/2, y + h/2 - th/2,
      ALLEGRO_ALIGN_CENTRE, get_label());

   float gain = get_gain();
   if (gain > 0.0) {
      float igain = 1.0 - clamp(0.0, gain, 2.0)/2.0;
      al_draw_rectangle(x+w+1.5, y+h*igain, x+w+3.5, y+h, ctx.fg, 1.0);
   }
}